

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Map.hpp
# Opt level: O1

AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> * __thiscall
Lib::
Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
::insert(Map<Kernel::Variable,_Inferences::AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet>,_Lib::StlHash>
         *this,Variable *key,AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *val,
        uint code)

{
  anon_struct_4_0_00000001_for___align aVar1;
  Entry *pEVar2;
  ulong uVar3;
  uint uVar4;
  Entry *pEVar5;
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  local_4c;
  
  pEVar2 = this->_entries;
  uVar3 = (ulong)code % (ulong)(uint)this->_capacity;
  pEVar5 = pEVar2 + uVar3;
  uVar4 = pEVar2[uVar3].code;
  if (uVar4 != 0) {
    do {
      if ((uVar4 == code) && (pEVar5->_key == (MaybeUninit<Kernel::Variable>)key->_num)) {
        return (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)&pEVar5->_value;
      }
      pEVar5 = pEVar5 + 1;
      if (pEVar5 == this->_afterLast) {
        pEVar5 = pEVar2;
      }
      uVar4 = pEVar5->code;
    } while (uVar4 != 0);
  }
  this->_noOfEntries = this->_noOfEntries + 1;
  aVar1 = (anon_struct_4_0_00000001_for___align)key->_num;
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl(&local_4c,
                (DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 *)val);
  (pEVar5->_key).__align = aVar1;
  CoproductImpl::TrivialOperations::MoveCons::
  DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
  ::DefaultImpl((DefaultImpl<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>_>_>_>_>
                 *)&(pEVar5->_value).__align,&local_4c);
  pEVar5->code = code;
  CoproductImpl::
  RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
  ::
  switchN<Lib::CoproductImpl::TrivialOperations::Destr::DefaultImpl<Lib::CoproductImpl::RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>>::~DefaultImpl()::_lambda(auto:1)_1_>
            ((RawCoproduct<Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::IntegerConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RationalConstantType>>,Inferences::AdditionGeneralizationImpl::MonomSet<Kernel::NumTraits<Kernel::RealConstantType>>>
              *)&local_4c,(anon_class_8_1_8991fb9c)&local_4c);
  return (AnyNumber<Inferences::AdditionGeneralizationImpl::MonomSet> *)&pEVar5->_value;
}

Assistant:

Val& insert(Key&& key, Val&& val,unsigned code)
  {
    Entry* entry;
    for (entry = firstEntryForCode(code); entry->occupied(); entry = nextEntry(entry)) {
      if (entry->code == code && Hash::equals(entry->key(),key)) {
        return entry->value();
      }
    }
    // entry is not occupied
    _noOfEntries++;
    entry->init(std::move(key), std::move(val), code);
    return entry->value();
  }